

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O3

bool __thiscall mcsFile::ReadNextSector(mcsFile *this)

{
  uchar uVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  RecInfo rec;
  byte local_47;
  RecInfo local_46;
  
  bVar2 = ProcessNextLine(this,&local_46);
  if (bVar2) {
    if (local_46.type == 4) {
      if (local_46.ndata == 2) {
        this->startAddr = (ulong)local_46.data[1] << 0x10;
        this->numBytes = 0;
        do {
          bVar2 = ProcessNextLine(this,&local_46);
          uVar1 = local_46.type;
          if (!bVar2) break;
          if (local_46.type == 0) {
            if (this->numBytes != (ulong)local_46.addr) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"ReadNextSector: line ",0x15);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", expected offset ",0x12);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got offset ",0xd);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              std::endl<char,std::char_traits<char>>(poVar3);
              return false;
            }
            uVar5 = (ulong)local_46.ndata;
            memcpy(this->curSector + this->numBytes,local_46.data,uVar5);
            uVar5 = uVar5 + this->numBytes;
            this->numBytes = uVar5;
          }
          else {
            if (local_46.type == 1) break;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ReadNextSector: line ",0x15);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," ignoring record type ",0x16)
            ;
            local_47 = uVar1;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_47,1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            uVar5 = this->numBytes;
          }
        } while (uVar5 < 0x10000);
        uVar5 = this->numBytes;
        if (uVar5 < 0x10000) {
          memset(this->curSector + uVar5,0xff,0x10000 - uVar5);
          return true;
        }
        if (uVar5 != 0x10000) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ReadNextSector: too many bytes = ",0x21);
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          return true;
        }
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ReadNextSector: line ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," has invalid data length = ",0x1b);
      local_47 = local_46.ndata;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_47,1);
      lVar4 = *(long *)poVar3;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ReadNextSector: line ",0x15);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->line_num);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," does not start a sector",0x18);
      lVar4 = *(long *)poVar3;
    }
    std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool mcsFile::ReadNextSector()
{
    RecInfo rec;
    if (!ProcessNextLine(rec)) return false;
    if (rec.type != RECORD_EXT_LINEAR) {
        std::cerr << "ReadNextSector: line " << line_num << " does not start a sector" << std::endl;
        return false;
    }
    if (rec.ndata != 2) {
        std::cerr << "ReadNextSector: line " << line_num << " has invalid data length = "
                  << rec.ndata << std::endl;
        return false;
    }
    startAddr = ((rec.data[0]<<16)+rec.data[1]) << 16;
    numBytes = 0L;
    while ((numBytes < sizeof(curSector)) && ProcessNextLine(rec)) {
        if (rec.type == RECORD_DATA) {
            if (numBytes != rec.addr) {
                std::cerr << "ReadNextSector: line " << line_num
                          << ", expected offset " << numBytes << ", got offset "
                          << rec.addr << std::endl;
                return false;
            }
            memcpy(curSector+numBytes, rec.data, rec.ndata);
            numBytes += rec.ndata;
        }
        else if (rec.type == RECORD_EOF)
            break;
        else
            std::cerr << "ReadNextSector: line " << line_num 
                      << " ignoring record type " << rec.type << std::endl;
    }
    // Pad sector with 0xff, just in case
    if (numBytes < sizeof(curSector)) {
        memset(curSector+numBytes, 0xff, sizeof(curSector)-numBytes);
    }
    else if (numBytes > sizeof(curSector))
        std::cerr << "ReadNextSector: too many bytes = " << numBytes << std::endl;
    return true;
}